

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUpdateLeft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *eps,
                 number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *vec,int *nonz,int n)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  cpp_dec_float<100U,_int,_void> *pcVar10;
  long lVar11;
  int iVar12;
  cpp_dec_float<100U,_int,_void> *v;
  long lVar13;
  cpp_dec_float<100U,_int,_void> *pcVar14;
  uint *puVar15;
  int *piVar16;
  bool bVar17;
  type t;
  int local_1c4;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  uint local_188 [3];
  undefined3 uStack_17b;
  uint uStack_178;
  bool bStack_174;
  undefined8 local_170;
  cpp_dec_float<100U,_int,_void> local_168;
  int *local_118;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_110;
  int *local_108;
  pointer local_100;
  int *local_f8;
  int *local_f0;
  long local_e8;
  long local_e0;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  iVar9 = (this->l).firstUpdate;
  local_e8 = (long)iVar9;
  iVar12 = (this->l).firstUnused;
  lVar13 = (long)iVar12;
  local_1c4 = n;
  if (iVar9 < iVar12) {
    local_100 = (this->l).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_108 = (this->l).idx;
    local_f0 = (this->l).row;
    local_f8 = (this->l).start;
    local_118 = nonz;
    local_110 = eps;
    do {
      iVar9 = local_f0[lVar13 + -1];
      lVar11 = (long)iVar9;
      local_e0 = lVar11 * 0x50;
      uVar1 = *(undefined8 *)vec[lVar11].m_backend.data._M_elems;
      uVar2 = *(undefined8 *)(vec[lVar11].m_backend.data._M_elems + 2);
      puVar15 = vec[lVar11].m_backend.data._M_elems + 4;
      uVar3 = *(undefined8 *)puVar15;
      uVar4 = *(undefined8 *)(puVar15 + 2);
      puVar15 = vec[lVar11].m_backend.data._M_elems + 8;
      uVar5 = *(undefined8 *)puVar15;
      uVar6 = *(undefined8 *)(puVar15 + 2);
      puVar15 = vec[lVar11].m_backend.data._M_elems + 0xc;
      uVar7 = *(undefined8 *)puVar15;
      uVar8 = *(undefined8 *)(puVar15 + 2);
      local_168.data._M_elems[0xc] = (uint)uVar7;
      local_168.data._M_elems[0xd] = (uint)((ulong)uVar7 >> 0x20);
      local_168.data._M_elems._56_5_ = SUB85(uVar8,0);
      local_168.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
      local_168.data._M_elems[8] = (uint)uVar5;
      local_168.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
      local_168.data._M_elems[10] = (uint)uVar6;
      local_168.data._M_elems[0xb] = (uint)((ulong)uVar6 >> 0x20);
      local_168.data._M_elems[4] = (uint)uVar3;
      local_168.data._M_elems[5] = (uint)((ulong)uVar3 >> 0x20);
      local_168.data._M_elems[6] = (uint)uVar4;
      local_168.data._M_elems[7] = (uint)((ulong)uVar4 >> 0x20);
      local_168.data._M_elems[0] = (uint)uVar1;
      local_168.data._M_elems[1] = (uint)((ulong)uVar1 >> 0x20);
      local_168.data._M_elems[2] = (uint)uVar2;
      local_168.data._M_elems[3] = (uint)((ulong)uVar2 >> 0x20);
      local_168.exp = vec[lVar11].m_backend.exp;
      local_168.neg = vec[lVar11].m_backend.neg;
      local_d8.fpclass = vec[lVar11].m_backend.fpclass;
      local_d8.prec_elem = vec[lVar11].m_backend.prec_elem;
      local_168.prec_elem = local_d8.prec_elem;
      local_168.fpclass = local_d8.fpclass;
      puVar15 = vec[lVar11].m_backend.data._M_elems + 1;
      local_d8.data._M_elems._4_8_ = *(undefined8 *)puVar15;
      local_d8.data._M_elems._12_8_ = *(undefined8 *)(puVar15 + 2);
      puVar15 = vec[lVar11].m_backend.data._M_elems + 5;
      local_d8.data._M_elems._20_8_ = *(undefined8 *)puVar15;
      local_d8.data._M_elems._28_8_ = *(undefined8 *)(puVar15 + 2);
      puVar15 = vec[lVar11].m_backend.data._M_elems + 9;
      local_d8.data._M_elems._36_8_ = *(undefined8 *)puVar15;
      uVar1 = *(undefined8 *)(puVar15 + 2);
      puVar15 = vec[lVar11].m_backend.data._M_elems + 0xc;
      local_d8.data._M_elems._56_8_ = *(undefined8 *)(puVar15 + 2);
      local_d8.data._M_elems[0xd] = (uint)((ulong)*(undefined8 *)puVar15 >> 0x20);
      local_d8.data._M_elems[0xb] = (uint)uVar1;
      local_d8.data._M_elems[0xc] = (uint)((ulong)uVar1 >> 0x20);
      local_d8.data._M_elems[0] = local_168.data._M_elems[0];
      local_d8.neg = (bool)((local_168.data._M_elems[0] != 0 ||
                            local_d8.fpclass != cpp_dec_float_finite) ^ local_168.neg);
      iVar12 = local_f8[lVar13];
      local_d8.exp = local_168.exp;
      if (iVar9 < iVar12) {
        piVar16 = local_108 + local_f8[lVar13 + -1];
        pcVar14 = &local_100[local_f8[lVar13 + -1]].m_backend;
        do {
          pcVar10 = &vec[*piVar16].m_backend;
          local_170._0_4_ = cpp_dec_float_finite;
          local_170._4_4_ = 0x10;
          local_1b8 = (undefined1  [16])0x0;
          local_1a8 = (undefined1  [16])0x0;
          local_198 = (undefined1  [16])0x0;
          local_188[0] = 0;
          local_188[1] = 0;
          stack0xfffffffffffffe80 = 0;
          uStack_17b = 0;
          uStack_178 = 0;
          bStack_174 = false;
          v = pcVar10;
          if ((pcVar14 != (cpp_dec_float<100U,_int,_void> *)local_1b8) &&
             (v = pcVar14, (cpp_dec_float<100U,_int,_void> *)local_1b8 != pcVar10)) {
            local_1b8 = *(undefined1 (*) [16])(pcVar10->data)._M_elems;
            local_1a8 = *(undefined1 (*) [16])((pcVar10->data)._M_elems + 4);
            local_198 = *(undefined1 (*) [16])((pcVar10->data)._M_elems + 8);
            local_188._0_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 0xc);
            uVar1 = *(undefined8 *)((pcVar10->data)._M_elems + 0xe);
            stack0xfffffffffffffe80 = (undefined5)uVar1;
            uStack_17b = (undefined3)((ulong)uVar1 >> 0x28);
            uStack_178 = pcVar10->exp;
            bStack_174 = pcVar10->neg;
            local_170._0_4_ = pcVar10->fpclass;
            local_170._4_4_ = pcVar10->prec_elem;
          }
          piVar16 = piVar16 + 1;
          pcVar14 = pcVar14 + 1;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    ((cpp_dec_float<100U,_int,_void> *)local_1b8,v);
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    (&local_d8,(cpp_dec_float<100U,_int,_void> *)local_1b8);
          iVar12 = iVar12 + -1;
        } while (iVar9 < iVar12);
      }
      puVar15 = (uint *)((long)(vec->m_backend).data._M_elems + local_e0);
      if (local_168.fpclass == cpp_dec_float_NaN) {
LAB_003fc03d:
        local_168.data._M_elems[0xd] = local_d8.data._M_elems[0xd];
        local_168.data._M_elems._56_5_ = local_d8.data._M_elems._56_5_;
        local_168.data._M_elems[0xf]._1_3_ = local_d8.data._M_elems[0xf]._1_3_;
        local_168.data._M_elems[9] = local_d8.data._M_elems[9];
        local_168.data._M_elems[10] = local_d8.data._M_elems[10];
        local_168.data._M_elems[0xb] = local_d8.data._M_elems[0xb];
        local_168.data._M_elems[0xc] = local_d8.data._M_elems[0xc];
        local_168.data._M_elems[5] = local_d8.data._M_elems[5];
        local_168.data._M_elems[6] = local_d8.data._M_elems[6];
        local_168.data._M_elems[7] = local_d8.data._M_elems[7];
        local_168.data._M_elems[8] = local_d8.data._M_elems[8];
        local_168.data._M_elems[1] = local_d8.data._M_elems[1];
        local_168.data._M_elems[2] = local_d8.data._M_elems[2];
        local_168.data._M_elems[3] = local_d8.data._M_elems[3];
        local_168.data._M_elems[4] = local_d8.data._M_elems[4];
        local_168.data._M_elems[0] = local_d8.data._M_elems[0];
        local_168.prec_elem = local_d8.prec_elem;
        local_168.fpclass = local_d8.fpclass;
        local_168.neg =
             (bool)((local_d8.data._M_elems[0] != 0 || local_d8.fpclass != cpp_dec_float_finite) ^
                   local_d8.neg);
        local_168.exp = local_d8.exp;
        if (local_d8.fpclass == cpp_dec_float_NaN) {
LAB_003fc0ce:
          local_1b8._8_4_ = local_168.data._M_elems[2];
          local_1b8._4_4_ = local_168.data._M_elems[1];
          local_1a8._4_4_ = local_168.data._M_elems[5];
          local_1a8._0_4_ = local_168.data._M_elems[4];
          local_1a8._12_4_ = local_168.data._M_elems[7];
          local_1a8._8_4_ = local_168.data._M_elems[6];
          local_198._4_4_ = local_168.data._M_elems[9];
          local_198._0_4_ = local_168.data._M_elems[8];
          local_198._12_4_ = local_168.data._M_elems[0xb];
          local_198._8_4_ = local_168.data._M_elems[10];
          local_188[1] = local_168.data._M_elems[0xd];
          local_188[0] = local_168.data._M_elems[0xc];
          stack0xfffffffffffffe80 = local_168.data._M_elems._56_5_;
          uStack_17b = local_168.data._M_elems[0xf]._1_3_;
          local_1b8._0_4_ = local_168.data._M_elems[0];
          local_1b8._12_4_ = local_168.data._M_elems[3];
          uStack_178 = local_168.exp;
          bStack_174 = local_168.neg;
          local_170._0_4_ = local_168.fpclass;
          local_170._4_4_ = local_168.prec_elem;
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<100U,_int,_void> *)local_1b8,0,(type *)0x0);
          iVar9 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            (&local_168,(cpp_dec_float<100U,_int,_void> *)local_1b8);
          if (iVar9 != 0) goto LAB_003fc0ce;
          local_170._0_4_ = cpp_dec_float_finite;
          local_170._4_4_ = 0x10;
          local_1b8 = ZEXT816(0);
          local_1a8 = ZEXT816(0);
          local_198 = ZEXT816(0);
          local_188[0] = 0;
          local_188[1] = 0;
          stack0xfffffffffffffe80 = 0;
          uStack_17b = 0;
          uStack_178 = 0;
          bStack_174 = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)local_1b8,1e-100);
        }
        *(undefined8 *)(puVar15 + 0xc) = local_188._0_8_;
        *(ulong *)(puVar15 + 0xe) = CONCAT35(uStack_17b,stack0xfffffffffffffe80);
        *(undefined8 *)(puVar15 + 8) = local_198._0_8_;
        *(undefined8 *)(puVar15 + 10) = local_198._8_8_;
        *(undefined8 *)(puVar15 + 4) = local_1a8._0_8_;
        *(undefined8 *)(puVar15 + 6) = local_1a8._8_8_;
        *puVar15 = local_1b8._0_4_;
        *(undefined8 *)(puVar15 + 1) = local_1b8._4_8_;
        puVar15[3] = local_1b8._12_4_;
        puVar15[0x10] = uStack_178;
        *(bool *)(puVar15 + 0x11) = bStack_174;
        puVar15[0x12] = (fpclass_type)local_170;
        puVar15[0x13] = local_170._4_4_;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<100U,_int,_void> *)local_1b8,0,(type *)0x0);
        iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_168,(cpp_dec_float<100U,_int,_void> *)local_1b8);
        if (iVar12 != 0) goto LAB_003fc03d;
        local_168.data._M_elems[0xd] = local_d8.data._M_elems[0xd];
        local_168.data._M_elems._56_5_ = local_d8.data._M_elems._56_5_;
        local_168.data._M_elems[0xf]._1_3_ = local_d8.data._M_elems[0xf]._1_3_;
        local_168.data._M_elems[9] = local_d8.data._M_elems[9];
        local_168.data._M_elems[10] = local_d8.data._M_elems[10];
        local_168.data._M_elems[0xb] = local_d8.data._M_elems[0xb];
        local_168.data._M_elems[0xc] = local_d8.data._M_elems[0xc];
        local_168.data._M_elems[5] = local_d8.data._M_elems[5];
        local_168.data._M_elems[6] = local_d8.data._M_elems[6];
        local_168.data._M_elems[7] = local_d8.data._M_elems[7];
        local_168.data._M_elems[8] = local_d8.data._M_elems[8];
        local_168.data._M_elems[1] = local_d8.data._M_elems[1];
        local_168.data._M_elems[2] = local_d8.data._M_elems[2];
        local_168.data._M_elems[3] = local_d8.data._M_elems[3];
        local_168.data._M_elems[4] = local_d8.data._M_elems[4];
        local_168.data._M_elems[0] = local_d8.data._M_elems[0];
        bVar17 = local_d8.data._M_elems[0] != 0 || local_d8.fpclass != cpp_dec_float_finite;
        local_168.neg = (bool)(local_d8.neg ^ bVar17);
        local_168.exp = local_d8.exp;
        local_168.prec_elem = local_d8.prec_elem;
        local_168.fpclass = local_d8.fpclass;
        local_1a8._4_4_ = local_168.data._M_elems[5];
        local_1a8._0_4_ = local_168.data._M_elems[4];
        local_1a8._12_4_ = local_168.data._M_elems[7];
        local_1a8._8_4_ = local_168.data._M_elems[6];
        local_198._4_4_ = local_168.data._M_elems[9];
        local_198._0_4_ = local_168.data._M_elems[8];
        local_198._12_4_ = local_d8.data._M_elems[0xb];
        local_198._8_4_ = local_168.data._M_elems[10];
        local_188[1] = local_d8.data._M_elems[0xd];
        local_188[0] = local_d8.data._M_elems[0xc];
        local_1b8._4_4_ = local_d8.data._M_elems[1];
        local_1b8._8_4_ = local_d8.data._M_elems[2];
        local_1b8._0_4_ = local_d8.data._M_elems[0];
        local_1b8._12_4_ = local_168.data._M_elems[3];
        local_88.data._M_elems._0_8_ = *(undefined8 *)(local_110->m_backend).data._M_elems;
        local_88.data._M_elems._8_8_ = *(undefined8 *)((local_110->m_backend).data._M_elems + 2);
        local_88.data._M_elems._16_8_ = *(undefined8 *)((local_110->m_backend).data._M_elems + 4);
        local_88.data._M_elems._24_8_ = *(undefined8 *)((local_110->m_backend).data._M_elems + 6);
        local_88.data._M_elems._32_8_ = *(undefined8 *)((local_110->m_backend).data._M_elems + 8);
        local_88.data._M_elems._40_8_ = *(undefined8 *)((local_110->m_backend).data._M_elems + 10);
        local_88.data._M_elems._48_8_ = *(undefined8 *)((local_110->m_backend).data._M_elems + 0xc);
        local_88.data._M_elems._56_8_ = *(undefined8 *)((local_110->m_backend).data._M_elems + 0xe);
        local_88.exp = (local_110->m_backend).exp;
        local_88.neg = (local_110->m_backend).neg;
        local_88.fpclass = (local_110->m_backend).fpclass;
        local_88.prec_elem = (local_110->m_backend).prec_elem;
        uStack_178 = local_d8.exp;
        local_170._4_4_ = local_d8.prec_elem;
        local_170._0_4_ = local_d8.fpclass;
        bStack_174 = local_168.neg;
        if ((local_d8.neg != bVar17) &&
           (local_d8.data._M_elems[0] != 0 || local_d8.fpclass != cpp_dec_float_finite)) {
          bStack_174 = (bool)(local_168.neg ^ 1);
        }
        unique0x10001587 = local_168.data._M_elems._56_5_;
        uStack_17b = local_168.data._M_elems[0xf]._1_3_;
        if ((local_88.fpclass != cpp_dec_float_NaN && local_d8.fpclass != cpp_dec_float_NaN) &&
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_1b8,&local_88), 0 < iVar12))
        {
          lVar11 = (long)local_1c4;
          local_1c4 = local_1c4 + 1;
          local_118[lVar11] = iVar9;
          *(ulong *)(puVar15 + 0xc) =
               CONCAT44(local_168.data._M_elems[0xd],local_168.data._M_elems[0xc]);
          *(ulong *)(puVar15 + 0xe) =
               CONCAT35(local_168.data._M_elems[0xf]._1_3_,local_168.data._M_elems._56_5_);
          *(ulong *)(puVar15 + 8) = CONCAT44(local_168.data._M_elems[9],local_168.data._M_elems[8]);
          *(ulong *)(puVar15 + 10) =
               CONCAT44(local_168.data._M_elems[0xb],local_168.data._M_elems[10]);
          *(ulong *)(puVar15 + 4) = CONCAT44(local_168.data._M_elems[5],local_168.data._M_elems[4]);
          *(ulong *)(puVar15 + 6) = CONCAT44(local_168.data._M_elems[7],local_168.data._M_elems[6]);
          *(ulong *)puVar15 = CONCAT44(local_168.data._M_elems[1],local_168.data._M_elems[0]);
          *(ulong *)(puVar15 + 2) = CONCAT44(local_168.data._M_elems[3],local_168.data._M_elems[2]);
          puVar15[0x10] = local_168.exp;
          *(bool *)(puVar15 + 0x11) = local_168.neg;
          puVar15[0x12] = local_168.fpclass;
          puVar15[0x13] = local_168.prec_elem;
        }
      }
      lVar13 = lVar13 + -1;
    } while (local_e8 < lVar13);
  }
  return local_1c4;
}

Assistant:

int CLUFactor<R>::solveUpdateLeft(R eps, R* vec, int* nonz, int n)
{
   int i, j, k, end;
   R y;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates! */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      k = lbeg[i];
      assert(k >= 0 && k < l.size);
      val = &lval[k];
      idx = &lidx[k];

      k = lrow[i];

      y = vec[k];
      StableSum<R> tmp(-y);

      for(j = lbeg[i + 1]; j > k; --j)
      {
         assert(*idx >= 0 && *idx < thedim);
         tmp += vec[*idx++] * (*val++);
      }

      if(y == 0)
      {
         y = -R(tmp);

         if(isNotZero(y, eps))
         {
            nonz[n++] = k;
            vec[k] = y;
         }
      }
      else
      {
         y = -R(tmp);
         vec[k] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
      }
   }

   return n;
}